

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.hpp
# Opt level: O0

int nowide::utf::utf_traits<char,_1>::trail_length(char_type ci)

{
  undefined4 local_c;
  uchar c;
  char_type ci_local;
  
  if ((byte)ci < 0x80) {
    local_c = 0;
  }
  else if ((byte)ci < 0xc2) {
    local_c = -1;
  }
  else if ((byte)ci < 0xe0) {
    local_c = 1;
  }
  else if ((byte)ci < 0xf0) {
    local_c = 2;
  }
  else if ((byte)ci < 0xf5) {
    local_c = 3;
  }
  else {
    local_c = -1;
  }
  return local_c;
}

Assistant:

static int trail_length(char_type ci) 
        {
            unsigned char c = ci;
            if(c < 128)
                return 0;
            if(NOWIDE_UNLIKELY(c < 194))
                return -1;
            if(c < 224)
                return 1;
            if(c < 240)
                return 2;
            if(NOWIDE_LIKELY(c <=244))
                return 3;
            return -1;
        }